

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.cpp
# Opt level: O3

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_18._0_5_ = CONCAT14(10,(undefined4)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 4),1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_18._0_6_ = CONCAT15(10,(undefined5)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 5),1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_18._0_7_ = CONCAT16(10,(undefined6)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 6),1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return 0;
}

Assistant:

int main() {
  int ages[] = { 15, 30, 60 };
  // Number of elements = 3
  std::cout << std::size(ages) << '\n';
  // Size of an element = 4
  std::cout << sizeof(ages[0]) << '\n';
  // Size of array = 12 (= 3 * 4)
  std::cout << sizeof(ages) << '\n';
  decay(ages);
}